

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O2

void __thiscall Iir::Cascade::setLayout(Cascade *this,LayoutBase *proto)

{
  double dVar1;
  int iVar2;
  PoleZeroPair *pair;
  int i;
  Biquad *pBVar3;
  double dVar4;
  complex<double> local_30;
  
  iVar2 = (proto->m_numPoles + 1) / 2;
  this->m_numStages = iVar2;
  if (this->m_maxStages < iVar2) {
    throw_invalid_argument("Number of stages is larger than the max stages.");
  }
  pBVar3 = this->m_stageArray;
  for (iVar2 = 0; iVar2 < this->m_maxStages; iVar2 = iVar2 + 1) {
    Biquad::setIdentity(pBVar3);
    pBVar3 = pBVar3 + 1;
  }
  pBVar3 = this->m_stageArray;
  for (iVar2 = 0; iVar2 < this->m_numStages; iVar2 = iVar2 + 1) {
    pair = LayoutBase::getPair(proto,iVar2);
    Biquad::setPoleZeroPair(pBVar3,pair);
    pBVar3 = pBVar3 + 1;
  }
  dVar1 = proto->m_normalGain;
  response(this,proto->m_normalW / 6.283185307179586);
  dVar4 = std::abs<double>(&local_30);
  applyScale(this,dVar1 / dVar4);
  return;
}

Assistant:

void Cascade::setLayout (const LayoutBase& proto)
	{
		const int numPoles = proto.getNumPoles();
		m_numStages = (numPoles + 1)/ 2;
		if (m_numStages > m_maxStages)
			throw_invalid_argument("Number of stages is larger than the max stages.");

		Biquad* stage = m_stageArray;
		for (int i = 0; i < m_maxStages; ++i, ++stage)
			stage->setIdentity();
  
		stage = m_stageArray;
		for (int i = 0; i < m_numStages; ++i, ++stage)
			stage->setPoleZeroPair (proto[i]);
  
		applyScale (proto.getNormalGain() /
			    std::abs (response (proto.getNormalW() / (2 * doublePi))));
	}